

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_unencode_gzip_write(connectdata *conn,SingleRequest *k,ssize_t nread)

{
  z_stream *z;
  uchar *puVar1;
  bool bVar2;
  int iVar3;
  zlibInitState zVar4;
  anon_enum_32 aVar5;
  CURLcode CVar6;
  char *__s1;
  Bytef *pBVar7;
  uint uVar8;
  uInt uVar9;
  ssize_t hlen;
  long local_30;
  
  z = &k->z;
  if (k->zlib_init == ZLIB_UNINIT) {
    (k->z).adler = 0;
    (k->z).reserved = 0;
    (k->z).opaque = (voidpf)0x0;
    *(undefined8 *)&(k->z).data_type = 0;
    (k->z).zalloc = (alloc_func)0x0;
    (k->z).zfree = (free_func)0x0;
    (k->z).msg = (char *)0x0;
    (k->z).state = (internal_state *)0x0;
    *(undefined8 *)&(k->z).avail_out = 0;
    (k->z).total_out = 0;
    (k->z).total_in = 0;
    (k->z).next_out = (Bytef *)0x0;
    z->next_in = (Bytef *)0x0;
    *(undefined8 *)&(k->z).avail_in = 0;
    (k->z).zalloc = zalloc_cb;
    (k->z).zfree = zfree_cb;
    __s1 = (char *)zlibVersion();
    iVar3 = strcmp(__s1,"1.2.0.4");
    if (iVar3 < 0) {
      iVar3 = inflateInit2_(z,0xfffffff1,"1.2.11");
      if (iVar3 != 0) goto LAB_001309e4;
      zVar4 = ZLIB_INIT;
    }
    else {
      iVar3 = inflateInit2_(z,0x2f,"1.2.11");
      if (iVar3 != 0) {
LAB_001309e4:
        process_zlib_error(conn,z);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      zVar4 = ZLIB_INIT_GZIP;
    }
    k->zlib_init = zVar4;
  }
  zVar4 = k->zlib_init;
  uVar9 = (uInt)nread;
  if (zVar4 == ZLIB_INIT) {
    puVar1 = (uchar *)k->str;
    aVar5 = check_gzip_header(puVar1,nread,&local_30);
    if (aVar5 == CURLIOCMD_LAST) {
      (k->z).avail_in = uVar9;
      pBVar7 = (Bytef *)(*Curl_cmalloc)(nread & 0xffffffff);
      (k->z).next_in = pBVar7;
      if (pBVar7 == (Bytef *)0x0) {
        inflateEnd(z);
        local_30 = 0x1b;
        goto LAB_00130abc;
      }
      memcpy(pBVar7,k->str,(ulong)(k->z).avail_in);
      local_30 = 0;
      zVar4 = ZLIB_GZIP_HEADER;
LAB_00130abe:
      bVar2 = false;
    }
    else {
      if (aVar5 != CURLDIGESTALGO_MD5) {
        process_zlib_error(conn,z);
        inflateEnd(z);
        local_30 = 0x3d;
LAB_00130abc:
        zVar4 = ZLIB_UNINIT;
        goto LAB_00130abe;
      }
      (k->z).next_in = puVar1 + local_30;
      (k->z).avail_in = uVar9 - (int)local_30;
      bVar2 = true;
      zVar4 = ZLIB_GZIP_INFLATING;
    }
    CVar6 = (CURLcode)local_30;
    k->zlib_init = zVar4;
joined_r0x00130ac9:
    if (!bVar2) {
      return CVar6;
    }
  }
  else {
    if (zVar4 == ZLIB_GZIP_HEADER) {
      uVar8 = (k->z).avail_in + uVar9;
      (k->z).avail_in = uVar8;
      pBVar7 = (Bytef *)Curl_saferealloc((k->z).next_in,(ulong)uVar8);
      (k->z).next_in = pBVar7;
      if (pBVar7 == (Bytef *)0x0) {
        inflateEnd(z);
        local_30 = 0x1b;
LAB_00130a9e:
        zVar4 = ZLIB_UNINIT;
        bVar2 = false;
LAB_00130aa2:
        CVar6 = (CURLcode)local_30;
        k->zlib_init = zVar4;
      }
      else {
        memcpy(pBVar7 + ((ulong)(k->z).avail_in - nread),k->str,nread);
        puVar1 = (k->z).next_in;
        aVar5 = check_gzip_header(puVar1,(ulong)(k->z).avail_in,&local_30);
        if (aVar5 != CURLIOCMD_LAST) {
          if (aVar5 != CURLDIGESTALGO_MD5) {
            (*Curl_cfree)(puVar1);
            process_zlib_error(conn,z);
            inflateEnd(z);
            local_30 = 0x3d;
            goto LAB_00130a9e;
          }
          (*Curl_cfree)(puVar1);
          uVar8 = (k->z).avail_in;
          (k->z).next_in = (Bytef *)(k->str + ((nread + local_30) - (ulong)uVar8));
          (k->z).avail_in = uVar8 - (int)local_30;
          bVar2 = true;
          zVar4 = ZLIB_GZIP_INFLATING;
          goto LAB_00130aa2;
        }
        CVar6 = CURLE_OK;
        bVar2 = false;
      }
      goto joined_r0x00130ac9;
    }
    if (zVar4 == ZLIB_INIT_GZIP) {
      (k->z).next_in = (Bytef *)k->str;
      (k->z).avail_in = uVar9;
      goto LAB_00130ad5;
    }
    (k->z).next_in = (Bytef *)k->str;
    (k->z).avail_in = uVar9;
  }
  if ((k->z).avail_in == 0) {
    return CURLE_OK;
  }
LAB_00130ad5:
  CVar6 = inflate_stream(conn,k);
  return CVar6;
}

Assistant:

CURLcode
Curl_unencode_gzip_write(struct connectdata *conn,
                         struct SingleRequest *k,
                         ssize_t nread)
{
  z_stream *z = &k->z;          /* zlib state structure */

  /* Initialize zlib? */
  if(k->zlib_init == ZLIB_UNINIT) {
    memset(z, 0, sizeof(z_stream));
    z->zalloc = (alloc_func)zalloc_cb;
    z->zfree = (free_func)zfree_cb;

    if(strcmp(zlibVersion(), "1.2.0.4") >= 0) {
      /* zlib ver. >= 1.2.0.4 supports transparent gzip decompressing */
      if(inflateInit2(z, MAX_WBITS+32) != Z_OK) {
        return process_zlib_error(conn, z);
      }
      k->zlib_init = ZLIB_INIT_GZIP; /* Transparent gzip decompress state */
    }
    else {
      /* we must parse the gzip header ourselves */
      if(inflateInit2(z, -MAX_WBITS) != Z_OK) {
        return process_zlib_error(conn, z);
      }
      k->zlib_init = ZLIB_INIT;   /* Initial call state */
    }
  }

  if(k->zlib_init == ZLIB_INIT_GZIP) {
    /* Let zlib handle the gzip decompression entirely */
    z->next_in = (Bytef *)k->str;
    z->avail_in = (uInt)nread;
    /* Now uncompress the data */
    return inflate_stream(conn, k);
  }

#ifndef OLD_ZLIB_SUPPORT
  /* Support for old zlib versions is compiled away and we are running with
     an old version, so return an error. */
  return exit_zlib(z, &k->zlib_init, CURLE_WRITE_ERROR);

#else
  /* This next mess is to get around the potential case where there isn't
   * enough data passed in to skip over the gzip header.  If that happens, we
   * malloc a block and copy what we have then wait for the next call.  If
   * there still isn't enough (this is definitely a worst-case scenario), we
   * make the block bigger, copy the next part in and keep waiting.
   *
   * This is only required with zlib versions < 1.2.0.4 as newer versions
   * can handle the gzip header themselves.
   */

  switch(k->zlib_init) {
  /* Skip over gzip header? */
  case ZLIB_INIT:
  {
    /* Initial call state */
    ssize_t hlen;

    switch(check_gzip_header((unsigned char *)k->str, nread, &hlen)) {
    case GZIP_OK:
      z->next_in = (Bytef *)k->str + hlen;
      z->avail_in = (uInt)(nread - hlen);
      k->zlib_init = ZLIB_GZIP_INFLATING; /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We need more data so we can find the end of the gzip header.  It's
       * possible that the memory block we malloc here will never be freed if
       * the transfer abruptly aborts after this point.  Since it's unlikely
       * that circumstances will be right for this code path to be followed in
       * the first place, and it's even more unlikely for a transfer to fail
       * immediately afterwards, it should seldom be a problem.
       */
      z->avail_in = (uInt)nread;
      z->next_in = malloc(z->avail_in);
      if(z->next_in == NULL) {
        return exit_zlib(z, &k->zlib_init, CURLE_OUT_OF_MEMORY);
      }
      memcpy(z->next_in, k->str, z->avail_in);
      k->zlib_init = ZLIB_GZIP_HEADER;   /* Need more gzip header data state */
      /* We don't have any data to inflate yet */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_GZIP_HEADER:
  {
    /* Need more gzip header data state */
    ssize_t hlen;
    z->avail_in += (uInt)nread;
    z->next_in = Curl_saferealloc(z->next_in, z->avail_in);
    if(z->next_in == NULL) {
      return exit_zlib(z, &k->zlib_init, CURLE_OUT_OF_MEMORY);
    }
    /* Append the new block of data to the previous one */
    memcpy(z->next_in + z->avail_in - nread, k->str, nread);

    switch(check_gzip_header(z->next_in, z->avail_in, &hlen)) {
    case GZIP_OK:
      /* This is the zlib stream data */
      free(z->next_in);
      /* Don't point into the malloced block since we just freed it */
      z->next_in = (Bytef *)k->str + hlen + nread - z->avail_in;
      z->avail_in = (uInt)(z->avail_in - hlen);
      k->zlib_init = ZLIB_GZIP_INFLATING;   /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We still don't have any data to inflate! */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      free(z->next_in);
      return exit_zlib(z, &k->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_GZIP_INFLATING:
  default:
    /* Inflating stream state */
    z->next_in = (Bytef *)k->str;
    z->avail_in = (uInt)nread;
    break;
  }

  if(z->avail_in == 0) {
    /* We don't have any data to inflate; wait until next time */
    return CURLE_OK;
  }

  /* We've parsed the header, now uncompress the data */
  return inflate_stream(conn, k);
#endif
}